

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

void trie_insert(trie_node *root,trie_node *new,uint lvl)

{
  byte bVar1;
  void *pvVar2;
  undefined8 uVar3;
  lrtr_ip_addr prefix;
  _Bool _Var4;
  trie_node *root_00;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff9c;
  lrtr_ip_addr local_58 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = root->len;
  if (new->len < bVar1) {
    local_58[0].u._12_4_ = (root->prefix).u.addr6.addr[3];
    local_58[0]._0_8_ = *(undefined8 *)&root->prefix;
    local_58[0].u._4_8_ = *(undefined8 *)((long)&(root->prefix).u + 4);
    pvVar2 = root->data;
    uVar3 = *(undefined8 *)((long)&(new->prefix).u + 4);
    *(undefined8 *)&root->prefix = *(undefined8 *)&new->prefix;
    *(undefined8 *)((long)&(root->prefix).u + 4) = uVar3;
    (root->prefix).u.addr6.addr[3] = (new->prefix).u.addr6.addr[3];
    root->len = new->len;
    root->data = new->data;
    (new->prefix).u.addr6.addr[3] = local_58[0].u._12_4_;
    *(undefined8 *)&new->prefix = local_58[0]._0_8_;
    *(undefined8 *)((long)&(new->prefix).u + 4) = local_58[0].u._4_8_;
    new->len = bVar1;
    new->data = pvVar2;
  }
  lrtr_ip_addr_get_bits(local_58,&new->prefix,(uint8_t)lvl,'\x01');
  prefix.u.addr6.addr[1] = local_58[0].u.addr6.addr[3];
  prefix._0_8_ = local_58[0].u._4_8_;
  prefix.u._8_8_ = in_stack_ffffffffffffff9c;
  _Var4 = lrtr_ip_addr_is_zero(prefix);
  if (_Var4) {
    root_00 = root->lchild;
    if (root_00 != (trie_node *)0x0) {
LAB_001131ba:
      trie_insert(root_00,new,lvl + 1);
      goto LAB_001131d0;
    }
    root->lchild = new;
  }
  else {
    root_00 = root->rchild;
    if (root_00 != (trie_node *)0x0) goto LAB_001131ba;
    root->rchild = new;
  }
  new->parent = root;
LAB_001131d0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void trie_insert(struct trie_node *root, struct trie_node *new, const unsigned int lvl)
{
	if (new->len < root->len)
		swap_nodes(root, new);

	if (is_left_child(&new->prefix, lvl)) {
		if (!root->lchild)
			return add_child_node(root, new, LEFT);

		return trie_insert(root->lchild, new, lvl + 1);
	}

	if (!root->rchild)
		return add_child_node(root, new, RIGHT);

	trie_insert(root->rchild, new, lvl + 1);
}